

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Model_get_index(HTS_Model *model,size_t state_index,char *string,size_t *tree_index,
                        size_t *pdf_index)

{
  HTS_Boolean HVar1;
  size_t sVar2;
  long *in_RCX;
  long in_RSI;
  long in_RDI;
  size_t *in_R8;
  HTS_Boolean find;
  HTS_Pattern *pattern;
  HTS_Tree *tree;
  char *in_stack_00000400;
  char *in_stack_00000408;
  undefined7 in_stack_ffffffffffffffc0;
  char cVar3;
  _HTS_Tree *in_stack_ffffffffffffffc8;
  long *local_30;
  
  *in_RCX = 2;
  *in_R8 = 1;
  if (*(long *)(in_RDI + 0x30) != 0) {
    cVar3 = '\0';
    for (local_30 = *(long **)(in_RDI + 0x30); local_30 != (long *)0x0;
        local_30 = (long *)local_30[1]) {
      if (local_30[3] == in_RSI) {
        in_stack_ffffffffffffffc8 = (_HTS_Tree *)*local_30;
        if (in_stack_ffffffffffffffc8 == (HTS_Tree *)0x0) {
          cVar3 = '\x01';
        }
        for (; in_stack_ffffffffffffffc8 != (HTS_Tree *)0x0;
            in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8->next) {
          HVar1 = HTS_pattern_match(in_stack_00000408,in_stack_00000400);
          if (HVar1 != '\0') {
            cVar3 = '\x01';
            break;
          }
        }
        if (cVar3 != '\0') break;
      }
      *in_RCX = *in_RCX + 1;
    }
    if (local_30 == (long *)0x0) {
      sVar2 = HTS_Tree_search_node
                        (in_stack_ffffffffffffffc8,(char *)CONCAT17(cVar3,in_stack_ffffffffffffffc0)
                        );
      *in_R8 = sVar2;
    }
    else {
      sVar2 = HTS_Tree_search_node
                        (in_stack_ffffffffffffffc8,(char *)CONCAT17(cVar3,in_stack_ffffffffffffffc0)
                        );
      *in_R8 = sVar2;
    }
  }
  return;
}

Assistant:

static void HTS_Model_get_index(HTS_Model * model, size_t state_index, const char *string, size_t * tree_index, size_t * pdf_index)
{
   HTS_Tree *tree;
   HTS_Pattern *pattern;
   HTS_Boolean find;

   (*tree_index) = 2;
   (*pdf_index) = 1;

   if (model->tree == NULL)
      return;

   find = FALSE;
   for (tree = model->tree; tree; tree = tree->next) {
      if (tree->state == state_index) {
         pattern = tree->head;
         if (!pattern)
            find = TRUE;
         for (; pattern; pattern = pattern->next)
            if (HTS_pattern_match(string, pattern->string)) {
               find = TRUE;
               break;
            }
         if (find)
            break;
      }
      (*tree_index)++;
   }

   if (tree != NULL) {
      (*pdf_index) = HTS_Tree_search_node(tree, string);
   } else {
      (*pdf_index) = HTS_Tree_search_node(model->tree, string);
   }
}